

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summary_impl.hpp
# Opt level: O0

void __thiscall
ylt::metric::detail::summary_impl<unsigned_long,_6UL>::data_t::stat_impl<true>
          (data_t *this,uint64_t *count,
          vector<std::pair<short,_unsigned_long>,_std::allocator<std::pair<short,_unsigned_long>_>_>
          *result,int i)

{
  __pointer_type paVar1;
  __pointer_type this_00;
  vector<std::pair<short,_unsigned_long>,_std::allocator<std::pair<short,_unsigned_long>_>_>
  *this_01;
  vector<std::pair<short,_unsigned_long>,_std::allocator<std::pair<short,_unsigned_long>_>_> *pvVar2
  ;
  short in_CX;
  size_type in_RDX;
  long *in_RSI;
  __int_type_conflict value;
  int j;
  __pointer_type piece;
  memory_order __b;
  size_type in_stack_ffffffffffffff88;
  array<std::atomic<std::array<std::atomic<unsigned_long>,_128UL>_*>,_128UL>
  *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  undefined4 uVar3;
  int local_44;
  
  std::array<std::atomic<std::array<std::atomic<unsigned_long>,_128UL>_*>,_128UL>::operator[]
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  this_00 = std::atomic<std::array<std::atomic<unsigned_long>,_128UL>_*>::load
                      ((atomic<std::array<std::atomic<unsigned_long>,_128UL>_*> *)
                       CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                       (memory_order)((ulong)in_stack_ffffffffffffff90 >> 0x20));
  if (this_00 != (__pointer_type)0x0) {
    local_44 = 0;
    while( true ) {
      this_01 = (vector<std::pair<short,_unsigned_long>,_std::allocator<std::pair<short,_unsigned_long>_>_>
                 *)(long)local_44;
      pvVar2 = (vector<std::pair<short,_unsigned_long>,_std::allocator<std::pair<short,_unsigned_long>_>_>
                *)std::array<std::atomic<unsigned_long>,_128UL>::size(this_00);
      if (pvVar2 <= this_01) break;
      in_stack_ffffffffffffff90 =
           (array<std::atomic<std::array<std::atomic<unsigned_long>,_128UL>_*>,_128UL> *)
           std::array<std::atomic<unsigned_long>,_128UL>::operator[]
                     ((array<std::atomic<unsigned_long>,_128UL> *)in_stack_ffffffffffffff90,
                      in_stack_ffffffffffffff88);
      std::operator&(relaxed,__memory_order_mask);
      uVar3 = 0;
      paVar1 = in_stack_ffffffffffffff90->_M_elems[0]._M_b._M_p;
      if (paVar1 != (__pointer_type)0x0) {
        in_stack_ffffffffffffff88 = in_RDX;
        get_ordered_index(in_CX * 0x80 + (short)local_44);
        std::vector<std::pair<short,unsigned_long>,std::allocator<std::pair<short,unsigned_long>>>::
        emplace_back<unsigned_short,unsigned_long&>
                  (this_01,(unsigned_short *)CONCAT44(uVar3,in_stack_ffffffffffffff98),
                   (unsigned_long *)in_stack_ffffffffffffff90);
        *in_RSI = (long)&paVar1->_M_elems[0].super___atomic_base<unsigned_long>._M_i + *in_RSI;
      }
      local_44 = local_44 + 1;
    }
  }
  return;
}

Assistant:

void stat_impl(uint64_t& count,
                   std::vector<std::pair<int16_t, uint_type>>& result, int i) {
      auto piece = arr[i].load(std::memory_order_relaxed);
      if (piece) {
        if constexpr (inc_order) {
          for (int j = 0; j < piece->size(); ++j) {
            auto value = (*piece)[j].load(std::memory_order_relaxed);
            if (value) {
              result.emplace_back(get_ordered_index(i * piece_size + j), value);
              count += value;
            }
          }
        }
        else {
          for (int j = piece->size() - 1; j >= 0; --j) {
            auto value = (*piece)[j].load(std::memory_order_relaxed);
            if (value) {
              result.emplace_back(get_ordered_index(i * piece_size + j), value);
              count += value;
            }
          }
        }
      }
    }